

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

int __thiscall
icu_63::PluralRules::select
          (PluralRules *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  double in_XMM0_Qa;
  
  FixedDecimal::FixedDecimal((FixedDecimal *)&stack0xffffffffffffffa8,in_XMM0_Qa);
  select(this,__nfds,(fd_set *)&stack0xffffffffffffffa8,__writefds,__exceptfds,__timeout);
  FixedDecimal::~FixedDecimal((FixedDecimal *)&stack0xffffffffffffffa8);
  return (int)this;
}

Assistant:

UnicodeString
PluralRules::select(double number) const {
    return select(FixedDecimal(number));
}